

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graphics.cpp
# Opt level: O3

void __thiscall nite::Batch::~Batch(Batch *this)

{
  pointer ppRVar1;
  
  unload(this);
  ppRVar1 = (this->objects).
            super__Vector_base<nite::Renderable_*,_std::allocator<nite::Renderable_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppRVar1 != (pointer)0x0) {
    operator_delete(ppRVar1);
    return;
  }
  return;
}

Assistant:

nite::Batch::~Batch(){
	unload();
}